

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void iadst16_stage9_avx2(__m256i *output,__m256i *x1)

{
  undefined1 auVar1 [32];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  __m256i __zero;
  
  uVar2 = in_RSI[1];
  uVar3 = in_RSI[2];
  uVar4 = in_RSI[3];
  *in_RDI = *in_RSI;
  in_RDI[1] = uVar2;
  in_RDI[2] = uVar3;
  in_RDI[3] = uVar4;
  auVar1 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])(in_RSI + 0x20));
  *(undefined1 (*) [32])(in_RDI + 4) = auVar1;
  uVar2 = in_RSI[0x31];
  uVar3 = in_RSI[0x32];
  uVar4 = in_RSI[0x33];
  in_RDI[8] = in_RSI[0x30];
  in_RDI[9] = uVar2;
  in_RDI[10] = uVar3;
  in_RDI[0xb] = uVar4;
  auVar1 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])(in_RSI + 0x10));
  *(undefined1 (*) [32])(in_RDI + 0xc) = auVar1;
  uVar2 = in_RSI[0x19];
  uVar3 = in_RSI[0x1a];
  uVar4 = in_RSI[0x1b];
  in_RDI[0x10] = in_RSI[0x18];
  in_RDI[0x11] = uVar2;
  in_RDI[0x12] = uVar3;
  in_RDI[0x13] = uVar4;
  auVar1 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])(in_RSI + 0x38));
  *(undefined1 (*) [32])(in_RDI + 0x14) = auVar1;
  uVar2 = in_RSI[0x29];
  uVar3 = in_RSI[0x2a];
  uVar4 = in_RSI[0x2b];
  in_RDI[0x18] = in_RSI[0x28];
  in_RDI[0x19] = uVar2;
  in_RDI[0x1a] = uVar3;
  in_RDI[0x1b] = uVar4;
  auVar1 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])(in_RSI + 8));
  *(undefined1 (*) [32])(in_RDI + 0x1c) = auVar1;
  uVar2 = in_RSI[0xd];
  uVar3 = in_RSI[0xe];
  uVar4 = in_RSI[0xf];
  in_RDI[0x20] = in_RSI[0xc];
  in_RDI[0x21] = uVar2;
  in_RDI[0x22] = uVar3;
  in_RDI[0x23] = uVar4;
  auVar1 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])(in_RSI + 0x2c));
  *(undefined1 (*) [32])(in_RDI + 0x24) = auVar1;
  uVar2 = in_RSI[0x3d];
  uVar3 = in_RSI[0x3e];
  uVar4 = in_RSI[0x3f];
  in_RDI[0x28] = in_RSI[0x3c];
  in_RDI[0x29] = uVar2;
  in_RDI[0x2a] = uVar3;
  in_RDI[0x2b] = uVar4;
  auVar1 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])(in_RSI + 0x1c));
  *(undefined1 (*) [32])(in_RDI + 0x2c) = auVar1;
  uVar2 = in_RSI[0x15];
  uVar3 = in_RSI[0x16];
  uVar4 = in_RSI[0x17];
  in_RDI[0x30] = in_RSI[0x14];
  in_RDI[0x31] = uVar2;
  in_RDI[0x32] = uVar3;
  in_RDI[0x33] = uVar4;
  auVar1 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])(in_RSI + 0x34));
  *(undefined1 (*) [32])(in_RDI + 0x34) = auVar1;
  uVar2 = in_RSI[0x25];
  uVar3 = in_RSI[0x26];
  uVar4 = in_RSI[0x27];
  in_RDI[0x38] = in_RSI[0x24];
  in_RDI[0x39] = uVar2;
  in_RDI[0x3a] = uVar3;
  in_RDI[0x3b] = uVar4;
  auVar1 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])(in_RSI + 4));
  *(undefined1 (*) [32])(in_RDI + 0x3c) = auVar1;
  return;
}

Assistant:

static inline void iadst16_stage9_avx2(__m256i *output, __m256i *x1) {
  const __m256i __zero = _mm256_setzero_si256();
  output[0] = x1[0];
  output[1] = _mm256_subs_epi16(__zero, x1[8]);
  output[2] = x1[12];
  output[3] = _mm256_subs_epi16(__zero, x1[4]);
  output[4] = x1[6];
  output[5] = _mm256_subs_epi16(__zero, x1[14]);
  output[6] = x1[10];
  output[7] = _mm256_subs_epi16(__zero, x1[2]);
  output[8] = x1[3];
  output[9] = _mm256_subs_epi16(__zero, x1[11]);
  output[10] = x1[15];
  output[11] = _mm256_subs_epi16(__zero, x1[7]);
  output[12] = x1[5];
  output[13] = _mm256_subs_epi16(__zero, x1[13]);
  output[14] = x1[9];
  output[15] = _mm256_subs_epi16(__zero, x1[1]);
}